

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

int Abc_SclComputeParametersPin(SC_Lib *p,SC_Cell *pCell,int iPin,float Slew,float *pLD,float *pPD)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  void *pvVar4;
  float *pfVar5;
  SC_Timing *pTime;
  int iVar6;
  SC_Pair SlewIn;
  SC_Pair ArrOut1;
  SC_Pair ArrOut0;
  SC_Pair SlewOut;
  SC_Pair ArrOut2;
  SC_Pair ArrIn;
  SC_Pair Load2;
  SC_Pair Load1;
  SC_Pair Load0;
  SC_Pair local_88;
  SC_Pair local_80;
  SC_Pair local_78;
  float *local_70;
  float *local_68;
  SC_Pair local_60;
  SC_Pair local_58;
  SC_Pair local_50;
  SC_Pair local_48;
  SC_Pair local_40;
  SC_Pair local_38;
  
  iVar6 = 0;
  local_50.rise = 0.0;
  local_50.fall = 0.0;
  local_78.rise = 0.0;
  local_78.fall = 0.0;
  local_80.rise = 0.0;
  local_80.fall = 0.0;
  local_58.rise = 0.0;
  local_58.fall = 0.0;
  local_60.rise = 0.0;
  local_60.fall = 0.0;
  local_88.rise = Slew;
  local_88.fall = Slew;
  pTime = Scl_CellPinTime(pCell,iPin);
  if (pTime != (SC_Timing *)0x0) {
    uVar3 = (pTime->pCellRise).vIndex1.nSize;
    if ((ulong)uVar3 == 1) {
      *pLD = 0.0;
      if ((pTime->pCellRise).vData.nSize < 1) {
LAB_0046922c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = *(pTime->pCellRise).vData.pArray;
      if (*(int *)((long)pvVar4 + 4) < 1) goto LAB_0046924b;
      local_78.rise = **(float **)((long)pvVar4 + 8);
    }
    else {
      local_38.rise = 0.0;
      local_38.fall = 0.0;
      local_70 = pLD;
      local_68 = pPD;
      if ((int)uVar3 < 1) {
LAB_0046924b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      pfVar5 = (pTime->pCellRise).vIndex1.pArray;
      fVar1 = *pfVar5;
      fVar2 = pfVar5[(ulong)uVar3 - 2];
      local_48.rise = fVar2;
      local_48.fall = fVar2;
      local_40.rise = fVar1;
      local_40.fall = fVar1;
      Scl_LibPinArrival(pTime,&local_50,&local_88,&local_38,&local_78,&local_60);
      Scl_LibPinArrival(pTime,&local_50,&local_88,&local_40,&local_80,&local_60);
      Scl_LibPinArrival(pTime,&local_50,&local_88,&local_48,&local_58,&local_60);
      local_78.rise = local_78.rise * 0.5 + local_78.fall * 0.5;
      local_80.rise = local_80.rise * 0.5 + local_80.fall * 0.5;
      local_58.rise = local_58.rise * 0.5 + local_58.fall * 0.5;
      if ((iPin < 0) || ((pCell->vPins).nSize <= iPin)) goto LAB_0046922c;
      pvVar4 = (pCell->vPins).pArray[(uint)iPin];
      *local_70 = (local_58.rise - local_80.rise) /
                  ((fVar2 - fVar1) /
                  (*(float *)((long)pvVar4 + 0x10) * 0.5 + *(float *)((long)pvVar4 + 0x14) * 0.5));
      pPD = local_68;
    }
    *pPD = local_78.rise;
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int Abc_SclComputeParametersPin( SC_Lib * p, SC_Cell * pCell, int iPin, float Slew, float * pLD, float * pPD )
{
    SC_Pair Load0, Load1, Load2;
    SC_Pair ArrIn  = { 0.0, 0.0 };
    SC_Pair SlewIn = { Slew, Slew };
    SC_Pair ArrOut0 = { 0.0, 0.0 };
    SC_Pair ArrOut1 = { 0.0, 0.0 };
    SC_Pair ArrOut2 = { 0.0, 0.0 };
    SC_Pair SlewOut = { 0.0, 0.0 };
    SC_Timing * pTime = Scl_CellPinTime( pCell, iPin );
    Vec_Flt_t * vIndex = pTime ? &pTime->pCellRise.vIndex1 : NULL; // capacitance
    if ( vIndex == NULL )
        return 0;
    // handle constant table
    if ( Vec_FltSize(vIndex) == 1 )
    {
        *pLD = 0;
        *pPD = Vec_FltEntry( (Vec_Flt_t *)Vec_PtrEntry(&pTime->pCellRise.vData, 0), 0 );
        return 1;
    }
    // get load points
    Load0.rise = Load0.fall = 0.0;
    Load1.rise = Load1.fall = Vec_FltEntry( vIndex, 0 );
    Load2.rise = Load2.fall = Vec_FltEntry( vIndex, Vec_FltSize(vIndex) - 2 );
    // compute delay
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load0, &ArrOut0, &SlewOut );
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load1, &ArrOut1, &SlewOut );
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load2, &ArrOut2, &SlewOut );
    ArrOut0.rise = 0.5 * ArrOut0.rise + 0.5 * ArrOut0.fall;
    ArrOut1.rise = 0.5 * ArrOut1.rise + 0.5 * ArrOut1.fall;
    ArrOut2.rise = 0.5 * ArrOut2.rise + 0.5 * ArrOut2.fall;
    // get tangent
    *pLD = (ArrOut2.rise - ArrOut1.rise) / ((Load2.rise - Load1.rise) / SC_CellPinCap(pCell, iPin));
    // get constant
    *pPD = ArrOut0.rise;
    return 1;
}